

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

void opj_get_all_encoding_parameters
               (opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 tileno,OPJ_INT32 *p_tx0,
               OPJ_INT32 *p_tx1,OPJ_INT32 *p_ty0,OPJ_INT32 *p_ty1,OPJ_UINT32 *p_dx_min,
               OPJ_UINT32 *p_dy_min,OPJ_UINT32 *p_max_prec,OPJ_UINT32 *p_max_res,
               OPJ_UINT32 **p_resolutions)

{
  uint uVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  OPJ_INT32 a;
  OPJ_INT32 a_00;
  OPJ_INT32 a_01;
  OPJ_INT32 a_02;
  OPJ_UINT32 OVar7;
  OPJ_INT32 a_03;
  OPJ_INT32 a_04;
  OPJ_INT32 a_05;
  OPJ_INT32 a_06;
  OPJ_INT32 OVar8;
  OPJ_INT32 OVar9;
  OPJ_INT32 OVar10;
  OPJ_INT32 OVar11;
  OPJ_UINT32 *pOVar12;
  OPJ_UINT32 local_d0;
  OPJ_UINT32 local_cc;
  OPJ_UINT32 l_dy;
  OPJ_UINT32 l_dx;
  OPJ_UINT32 l_ph;
  OPJ_UINT32 l_pw;
  OPJ_UINT32 l_pdy;
  OPJ_UINT32 l_pdx;
  OPJ_INT32 l_tcy1;
  OPJ_INT32 l_tcx1;
  OPJ_INT32 l_tcy0;
  OPJ_INT32 l_tcx0;
  OPJ_UINT32 l_product;
  OPJ_INT32 py1;
  OPJ_INT32 l_px1;
  OPJ_INT32 l_py0;
  OPJ_INT32 l_px0;
  OPJ_INT32 l_ry1;
  OPJ_INT32 l_rx1;
  OPJ_INT32 l_ry0;
  OPJ_INT32 l_rx0;
  OPJ_UINT32 l_level_no;
  OPJ_UINT32 l_ty0;
  OPJ_UINT32 l_tx0;
  OPJ_UINT32 q;
  OPJ_UINT32 p;
  OPJ_UINT32 *lResolutionPtr;
  opj_image_comp_t *l_img_comp;
  opj_tccp_t *l_tccp;
  opj_tcp_t *tcp;
  OPJ_UINT32 resno;
  OPJ_UINT32 compno;
  OPJ_INT32 *p_ty0_local;
  OPJ_INT32 *p_tx1_local;
  OPJ_INT32 *p_tx0_local;
  OPJ_UINT32 tileno_local;
  opj_cp_t *p_cp_local;
  opj_image_t *p_image_local;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x371,
                  "void opj_get_all_encoding_parameters(const opj_image_t *, const opj_cp_t *, OPJ_UINT32, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 **)"
                 );
  }
  if (p_image != (opj_image_t *)0x0) {
    if (tileno < p_cp->tw * p_cp->th) {
      l_img_comp = (opj_image_comp_t *)p_cp->tcps[tileno].tccps;
      lResolutionPtr = &p_image->comps->dx;
      uVar1 = p_cp->tw;
      OVar5 = p_cp->tx0 + (tileno % p_cp->tw) * p_cp->tdx;
      OVar6 = opj_uint_max(OVar5,p_image->x0);
      *p_tx0 = OVar6;
      OVar5 = opj_uint_adds(OVar5,p_cp->tdx);
      OVar5 = opj_uint_min(OVar5,p_image->x1);
      *p_tx1 = OVar5;
      OVar5 = p_cp->ty0 + (tileno / uVar1) * p_cp->tdy;
      OVar6 = opj_uint_max(OVar5,p_image->y0);
      *p_ty0 = OVar6;
      OVar5 = opj_uint_adds(OVar5,p_cp->tdy);
      OVar5 = opj_uint_min(OVar5,p_image->y1);
      *p_ty1 = OVar5;
      *p_max_prec = 0;
      *p_max_res = 0;
      *p_dx_min = 0x7fffffff;
      *p_dy_min = 0x7fffffff;
      for (tcp._4_4_ = 0; tcp._4_4_ < p_image->numcomps; tcp._4_4_ = tcp._4_4_ + 1) {
        _q = p_resolutions[tcp._4_4_];
        a = opj_int_ceildiv(*p_tx0,*lResolutionPtr);
        a_00 = opj_int_ceildiv(*p_ty0,lResolutionPtr[1]);
        a_01 = opj_int_ceildiv(*p_tx1,*lResolutionPtr);
        a_02 = opj_int_ceildiv(*p_ty1,lResolutionPtr[1]);
        if (*p_max_res < l_img_comp->dy) {
          *p_max_res = l_img_comp->dy;
        }
        l_ry0 = l_img_comp->dy;
        for (tcp._0_4_ = 0; (uint)tcp < l_img_comp->dy; tcp._0_4_ = (uint)tcp + 1) {
          l_ry0 = l_ry0 + -1;
          OVar5 = *(OPJ_UINT32 *)(&l_img_comp[0xc].field_0x2c + (ulong)(uint)tcp * 4);
          OVar6 = *(OPJ_UINT32 *)((long)&l_img_comp[0xe].data + (ulong)(uint)tcp * 4);
          *_q = OVar5;
          _q[1] = OVar6;
          cVar3 = (char)l_ry0;
          bVar2 = (byte)OVar5;
          if ((OVar5 + l_ry0 < 0x20) &&
             (*lResolutionPtr <= (uint)(0xffffffff / (ulong)(uint)(1 << (bVar2 + cVar3 & 0x1f))))) {
            OVar7 = opj_int_min(*p_dx_min,*lResolutionPtr * (1 << (bVar2 + cVar3 & 0x1f)));
            *p_dx_min = OVar7;
          }
          bVar4 = (byte)OVar6;
          if ((OVar6 + l_ry0 < 0x20) &&
             (lResolutionPtr[1] <= (uint)(0xffffffff / (ulong)(uint)(1 << (bVar4 + cVar3 & 0x1f)))))
          {
            OVar7 = opj_int_min(*p_dy_min,lResolutionPtr[1] * (1 << (bVar4 + cVar3 & 0x1f)));
            *p_dy_min = OVar7;
          }
          a_03 = opj_int_ceildivpow2(a,l_ry0);
          a_04 = opj_int_ceildivpow2(a_00,l_ry0);
          a_05 = opj_int_ceildivpow2(a_01,l_ry0);
          a_06 = opj_int_ceildivpow2(a_02,l_ry0);
          OVar8 = opj_int_floordivpow2(a_03,OVar5);
          OVar9 = opj_int_floordivpow2(a_04,OVar6);
          OVar10 = opj_int_ceildivpow2(a_05,OVar5);
          OVar11 = opj_int_ceildivpow2(a_06,OVar6);
          if (a_03 == a_05) {
            local_cc = 0;
          }
          else {
            local_cc = (OVar10 << (bVar2 & 0x1f)) - (OVar8 << (bVar2 & 0x1f)) >> (bVar2 & 0x1f);
          }
          if (a_04 == a_06) {
            local_d0 = 0;
          }
          else {
            local_d0 = (OVar11 << (bVar4 & 0x1f)) - (OVar9 << (bVar4 & 0x1f)) >> (bVar4 & 0x1f);
          }
          pOVar12 = _q + 3;
          _q[2] = local_cc;
          _q = _q + 4;
          *pOVar12 = local_d0;
          if (*p_max_prec < local_cc * local_d0) {
            *p_max_prec = local_cc * local_d0;
          }
        }
        l_img_comp = (opj_image_comp_t *)&l_img_comp[0x10].alpha;
        lResolutionPtr = lResolutionPtr + 0x10;
      }
      return;
    }
    __assert_fail("tileno < p_cp->tw * p_cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x373,
                  "void opj_get_all_encoding_parameters(const opj_image_t *, const opj_cp_t *, OPJ_UINT32, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 **)"
                 );
  }
  __assert_fail("p_image != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                ,0x372,
                "void opj_get_all_encoding_parameters(const opj_image_t *, const opj_cp_t *, OPJ_UINT32, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 **)"
               );
}

Assistant:

static void opj_get_all_encoding_parameters(const opj_image_t *p_image,
        const opj_cp_t *p_cp,
        OPJ_UINT32 tileno,
        OPJ_INT32 * p_tx0,
        OPJ_INT32 * p_tx1,
        OPJ_INT32 * p_ty0,
        OPJ_INT32 * p_ty1,
        OPJ_UINT32 * p_dx_min,
        OPJ_UINT32 * p_dy_min,
        OPJ_UINT32 * p_max_prec,
        OPJ_UINT32 * p_max_res,
        OPJ_UINT32 ** p_resolutions)
{
    /* loop*/
    OPJ_UINT32 compno, resno;

    /* pointers*/
    const opj_tcp_t *tcp = 00;
    const opj_tccp_t * l_tccp = 00;
    const opj_image_comp_t * l_img_comp = 00;

    /* to store l_dx, l_dy, w and h for each resolution and component.*/
    OPJ_UINT32 * lResolutionPtr;

    /* position in x and y of tile*/
    OPJ_UINT32 p, q;

    /* non-corrected (in regard to image offset) tile offset */
    OPJ_UINT32 l_tx0, l_ty0;

    /* preconditions in debug*/
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(tileno < p_cp->tw * p_cp->th);

    /* initializations*/
    tcp = &p_cp->tcps [tileno];
    l_tccp = tcp->tccps;
    l_img_comp = p_image->comps;

    /* position in x and y of tile*/
    p = tileno % p_cp->tw;
    q = tileno / p_cp->tw;

    /* here calculation of tx0, tx1, ty0, ty1, maxprec, l_dx and l_dy */
    l_tx0 = p_cp->tx0 + p *
            p_cp->tdx; /* can't be greater than p_image->x1 so won't overflow */
    *p_tx0 = (OPJ_INT32)opj_uint_max(l_tx0, p_image->x0);
    *p_tx1 = (OPJ_INT32)opj_uint_min(opj_uint_adds(l_tx0, p_cp->tdx), p_image->x1);
    l_ty0 = p_cp->ty0 + q *
            p_cp->tdy; /* can't be greater than p_image->y1 so won't overflow */
    *p_ty0 = (OPJ_INT32)opj_uint_max(l_ty0, p_image->y0);
    *p_ty1 = (OPJ_INT32)opj_uint_min(opj_uint_adds(l_ty0, p_cp->tdy), p_image->y1);

    /* max precision and resolution is 0 (can only grow)*/
    *p_max_prec = 0;
    *p_max_res = 0;

    /* take the largest value for dx_min and dy_min*/
    *p_dx_min = 0x7fffffff;
    *p_dy_min = 0x7fffffff;

    for (compno = 0; compno < p_image->numcomps; ++compno) {
        /* aritmetic variables to calculate*/
        OPJ_UINT32 l_level_no;
        OPJ_INT32 l_rx0, l_ry0, l_rx1, l_ry1;
        OPJ_INT32 l_px0, l_py0, l_px1, py1;
        OPJ_UINT32 l_product;
        OPJ_INT32 l_tcx0, l_tcy0, l_tcx1, l_tcy1;
        OPJ_UINT32 l_pdx, l_pdy, l_pw, l_ph;

        lResolutionPtr = p_resolutions[compno];

        l_tcx0 = opj_int_ceildiv(*p_tx0, (OPJ_INT32)l_img_comp->dx);
        l_tcy0 = opj_int_ceildiv(*p_ty0, (OPJ_INT32)l_img_comp->dy);
        l_tcx1 = opj_int_ceildiv(*p_tx1, (OPJ_INT32)l_img_comp->dx);
        l_tcy1 = opj_int_ceildiv(*p_ty1, (OPJ_INT32)l_img_comp->dy);

        if (l_tccp->numresolutions > *p_max_res) {
            *p_max_res = l_tccp->numresolutions;
        }

        /* use custom size for precincts*/
        l_level_no = l_tccp->numresolutions;
        for (resno = 0; resno < l_tccp->numresolutions; ++resno) {
            OPJ_UINT32 l_dx, l_dy;

            --l_level_no;

            /* precinct width and height*/
            l_pdx = l_tccp->prcw[resno];
            l_pdy = l_tccp->prch[resno];
            *lResolutionPtr++ = l_pdx;
            *lResolutionPtr++ = l_pdy;
            if (l_pdx + l_level_no < 32 &&
                    l_img_comp->dx <= UINT_MAX / (1u << (l_pdx + l_level_no))) {
                l_dx = l_img_comp->dx * (1u << (l_pdx + l_level_no));
                /* take the minimum size for l_dx for each comp and resolution*/
                *p_dx_min = (OPJ_UINT32)opj_int_min((OPJ_INT32) * p_dx_min, (OPJ_INT32)l_dx);
            }
            if (l_pdy + l_level_no < 32 &&
                    l_img_comp->dy <= UINT_MAX / (1u << (l_pdy + l_level_no))) {
                l_dy = l_img_comp->dy * (1u << (l_pdy + l_level_no));
                *p_dy_min = (OPJ_UINT32)opj_int_min((OPJ_INT32) * p_dy_min, (OPJ_INT32)l_dy);
            }

            /* various calculations of extents*/
            l_rx0 = opj_int_ceildivpow2(l_tcx0, (OPJ_INT32)l_level_no);
            l_ry0 = opj_int_ceildivpow2(l_tcy0, (OPJ_INT32)l_level_no);
            l_rx1 = opj_int_ceildivpow2(l_tcx1, (OPJ_INT32)l_level_no);
            l_ry1 = opj_int_ceildivpow2(l_tcy1, (OPJ_INT32)l_level_no);
            l_px0 = opj_int_floordivpow2(l_rx0, (OPJ_INT32)l_pdx) << l_pdx;
            l_py0 = opj_int_floordivpow2(l_ry0, (OPJ_INT32)l_pdy) << l_pdy;
            l_px1 = opj_int_ceildivpow2(l_rx1, (OPJ_INT32)l_pdx) << l_pdx;
            py1 = opj_int_ceildivpow2(l_ry1, (OPJ_INT32)l_pdy) << l_pdy;
            l_pw = (l_rx0 == l_rx1) ? 0 : (OPJ_UINT32)((l_px1 - l_px0) >> l_pdx);
            l_ph = (l_ry0 == l_ry1) ? 0 : (OPJ_UINT32)((py1 - l_py0) >> l_pdy);
            *lResolutionPtr++ = l_pw;
            *lResolutionPtr++ = l_ph;
            l_product = l_pw * l_ph;

            /* update precision*/
            if (l_product > *p_max_prec) {
                *p_max_prec = l_product;
            }

        }
        ++l_tccp;
        ++l_img_comp;
    }
}